

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O1

void replace_port_zero(char *addr,char *buf,int port)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char local_58 [8];
  char num [16];
  
  cVar2 = *addr;
  uVar6 = 0;
  if (cVar2 != '\0') {
    pcVar7 = addr + 1;
    bVar1 = false;
    do {
      iVar5 = (int)uVar6;
      bVar1 = (bool)(~bVar1 & 1U | cVar2 != '0');
      if (bVar1) {
        buf[iVar5] = cVar2;
        iVar3 = 1;
      }
      else {
        snprintf(local_58,0x10,"%d",(ulong)(uint)port);
        sVar4 = strlen(local_58);
        memcpy(buf + iVar5,local_58,sVar4);
        sVar4 = strlen(local_58);
        iVar3 = (int)sVar4;
      }
      bVar1 = bVar1 && cVar2 == ':';
      uVar6 = (ulong)(uint)(iVar5 + iVar3);
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar2 != '\0');
    uVar6 = (ulong)(iVar5 + iVar3);
  }
  buf[uVar6] = '\0';
  return;
}

Assistant:

static void
replace_port_zero(const char *addr, char *buf, int port)
{
	int  i;
	int  j;
	bool colon = false;
	char c;

	for (i = 0, j = 0; (c = addr[i]) != '\0'; i++) {

		if (colon && c == '0') {
			char num[16];
			(void) snprintf(num, sizeof(num), "%d", port);
			memcpy(&buf[j], num, strlen(num));
			j += (int) strlen(num);
			colon = false;
			continue;
		}
		colon    = c == ':';
		buf[j++] = c;
	}
	buf[j] = '\0';
}